

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int __fd;
  int iVar1;
  char *pcVar2;
  ssize_t sVar3;
  ushort uVar4;
  ulong uVar5;
  ulong uVar6;
  int sock_client;
  socklen_t addr_size;
  thread tsend;
  _func_void_int *local_50;
  thread local_48;
  sockaddr_in addr;
  
  tsend._M_id._M_thread = (id)0;
  uVar5 = 0;
  __fd = socket(2,1,0);
  if (__fd == -1) {
    pcVar2 = "Erro ao criar socket";
  }
  else {
    uVar6 = (ulong)(uint)argc;
    if (argc < 1) {
      uVar6 = uVar5;
    }
    do {
      if (uVar6 == uVar5) {
        uVar4 = 0x15e0;
        goto LAB_0010377e;
      }
      iVar1 = strcmp(argv[uVar5],"--port");
      uVar5 = uVar5 + 1;
    } while (iVar1 != 0);
    iVar1 = atoi(argv[uVar5]);
    uVar4 = (ushort)iVar1;
    printf("porta: %d\n",(ulong)(uint)(int)(short)uVar4);
LAB_0010377e:
    addr.sin_family = 2;
    addr.sin_port = uVar4 << 8 | uVar4 >> 8;
    addr.sin_addr.s_addr = 0;
    addr.sin_zero[0] = '\0';
    addr.sin_zero[1] = '\0';
    addr.sin_zero[2] = '\0';
    addr.sin_zero[3] = '\0';
    addr.sin_zero[4] = '\0';
    addr.sin_zero[5] = '\0';
    addr.sin_zero[6] = '\0';
    addr.sin_zero[7] = '\0';
    iVar1 = bind(__fd,(sockaddr *)&addr,0x10);
    if (iVar1 == -1) {
      pcVar2 = "Erro na funcao bind()";
    }
    else {
      iVar1 = listen(__fd,1);
      if (iVar1 == -1) {
        puts("Erro na funcao listen()");
        goto LAB_001037c3;
      }
      while (sock_client = accept(__fd,(sockaddr *)0x0,(socklen_t *)0x0), sock_client != -1) {
        addr_size = 0x10;
        getpeername(sock_client,(sockaddr *)&addr,&addr_size);
        iVar1 = sock_client;
        pcVar2 = inet_ntoa((in_addr)addr.sin_addr.s_addr);
        printf("\x1b[94mClient connected\x1b[0m: %d (%s)\n",(ulong)(uint)iVar1,pcVar2);
        sVar3 = recv(sock_client,names + sock_client,1000,0);
        if ((int)sVar3 + 1U < 2) {
          close(sock_client);
        }
        else {
          names[sock_client][(int)sVar3] = '\0';
          std::mutex::lock(&mutsocks);
          std::vector<int,_std::allocator<int>_>::push_back(&socks,&sock_client);
          pthread_mutex_unlock((pthread_mutex_t *)&mutsocks);
          send_thread();
          local_50 = rcv_thread;
          std::thread::thread<void(*)(int),int&,void>(&local_48,&local_50,&sock_client);
          std::thread::detach();
          std::thread::~thread(&local_48);
        }
      }
      pcVar2 = "Erro na funcao accept()";
      sock_client = -1;
    }
  }
  perror(pcVar2);
LAB_001037c3:
  std::thread::~thread(&tsend);
  return 1;
}

Assistant:

int main(int argc, char **argv) {

  std::thread tsend;
  int sockfd, sock_client;
  unsigned int port;
  struct sockaddr_in addr;

  sockfd = socket(AF_INET, SOCK_STREAM, 0);

  if(sockfd == -1) {
    perror("Erro ao criar socket");
    return 1;
  }
  port = 5600;
  for (int i = 0; i < argc; i++) {
    if(strcmp(argv[i],"--port") == 0) {
      port = (short)atoi(argv[i+1]);
      printf("porta: %d\n", port);
      break;
    }
  }



  addr.sin_family = AF_INET;
  addr.sin_port   = htons(port);
  addr.sin_addr.s_addr = INADDR_ANY;

  memset(&addr.sin_zero,0,sizeof(addr.sin_zero));

  if(bind(sockfd,(struct sockaddr*)&addr,sizeof(addr)) == -1) {
    perror("Erro na funcao bind()");
    return 1;
  }
  if(listen(sockfd,1) == -1) {
    printf("Erro na funcao listen()\n");
    return 1;
  }

  while(1) {
    sock_client = accept(sockfd,0,0);
    if(sock_client == -1) {
      perror("Erro na funcao accept()");
      return 1;
    }
    else {
      // Get client info
      socklen_t addr_size = sizeof(struct sockaddr_in);
      int res = getpeername(sock_client, (struct sockaddr*)&addr, &addr_size);
      printf("\033[94mClient connected\033[0m: %d (%s)\n", sock_client, inet_ntoa(addr.sin_addr));
      int mlen = recv(sock_client, names[sock_client], MSG_LEN,0);
      if(mlen == -1 || mlen == 0) {
        close(sock_client);
      }
      else {
        names[sock_client][mlen]='\0';
        mutsocks.lock();
        socks.push_back(sock_client);
        mutsocks.unlock();
        send_thread();
        std::thread(&rcv_thread,sock_client).detach();
      }
    }
  }

  tsend.join();
  for(int i = 0; i < socks.size(); i++) {
    close(socks[i]);
  }

  close(sockfd);
  return 0;
}